

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallsList.cpp
# Opt level: O2

SimpleString __thiscall
MockExpectedCallsList::fulfilledCallsToString(MockExpectedCallsList *this,SimpleString *linePrefix)

{
  char cVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  SimpleString SVar2;
  SimpleString str;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  
  SimpleString::SimpleString(&local_60,"");
  while (linePrefix = (SimpleString *)linePrefix->bufferSize_, linePrefix != (SimpleString *)0x0) {
    cVar1 = (**(code **)(*(long *)linePrefix->buffer_ + 0x180))();
    if (cVar1 != '\0') {
      (**(code **)(*(long *)linePrefix->buffer_ + 0x1e0))(&local_50);
      appendStringOnANewLine(&local_40,&local_60,in_RDX);
      SimpleString::operator=(&local_60,&local_40);
      SimpleString::~SimpleString(&local_40);
      SimpleString::~SimpleString(&local_50);
    }
  }
  stringOrNoneTextWhenEmpty((SimpleString *)this,&local_60);
  SimpleString::~SimpleString(&local_60);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString MockExpectedCallsList::fulfilledCallsToString(const SimpleString& linePrefix) const
{
    SimpleString str;

    for (MockExpectedCallsListNode* p = head_; p; p = p->next_)
        if (p->expectedCall_->isFulfilled())
            str = appendStringOnANewLine(str, linePrefix, p->expectedCall_->callToString());

    return stringOrNoneTextWhenEmpty(str, linePrefix);
}